

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O1

bool GUIComponentParse(uint32_t line_number,string *gui_component_line,string *uniform_line,
                      vector<GUIComponent,_std::allocator<GUIComponent>_> *previous_components,
                      GUIComponent *out_component,string *out_parse_error)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pGVar4;
  size_t sVar5;
  size_t __n;
  bool bVar6;
  int iVar7;
  EGUIUniformType EVar8;
  long *plVar9;
  size_type *psVar10;
  ulong *puVar11;
  uint uVar12;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  ulong uVar15;
  EGUIComponentType EVar16;
  GUIComponent *previous_component;
  pointer pGVar17;
  string uniform_type;
  string component_name;
  anon_class_16_2_f93b81b2 ReportError;
  string component_data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniform_tokens;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  anon_class_16_2_f93b81b2 local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  vector<GUIComponent,_std::allocator<GUIComponent>_> *local_40;
  uint32_t local_34;
  
  local_a8.line_number = &local_34;
  local_a8.out_parse_error = out_parse_error;
  local_34 = line_number;
  if (uniform_line->_M_string_length == 0) {
    std::operator+(&local_78,"GUI type not associated with any uniform \'",gui_component_line);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_78);
    psVar10 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_c8.field_2._M_allocated_capacity = *psVar10;
      local_c8.field_2._8_8_ = plVar9[3];
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar10;
      local_c8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_c8._M_string_length = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    GUIComponentParse::anon_class_16_2_f93b81b2::operator()(&local_a8,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  if (gui_component_line->_M_string_length != 0) {
    uVar12 = 1;
    uVar15 = 0;
    do {
      if ((gui_component_line->_M_dataplus)._M_p[uVar15] == '(') break;
      uVar15 = (ulong)uVar12;
      uVar12 = uVar12 + 1;
    } while (uVar15 < gui_component_line->_M_string_length);
  }
  EVar16 = EGUIComponentTypeSlider1;
  local_40 = previous_components;
  std::__cxx11::string::substr((ulong)&local_c8,(ulong)gui_component_line);
  std::__cxx11::string::substr((ulong)&local_78,(ulong)gui_component_line);
  iVar7 = std::__cxx11::string::compare((char *)&local_c8);
  bVar6 = true;
  if (iVar7 != 0) {
    iVar7 = std::__cxx11::string::compare((char *)&local_c8);
    if (iVar7 == 0) {
      EVar16 = EGUIComponentTypeSlider2;
      goto LAB_00118a20;
    }
    iVar7 = std::__cxx11::string::compare((char *)&local_c8);
    if (iVar7 == 0) {
      EVar16 = EGUIComponentTypeSlider3;
      goto LAB_00118a20;
    }
    iVar7 = std::__cxx11::string::compare((char *)&local_c8);
    if (iVar7 == 0) {
      EVar16 = EGUIComponentTypeSlider4;
      goto LAB_00118a20;
    }
    iVar7 = std::__cxx11::string::compare((char *)&local_c8);
    if (iVar7 == 0) {
      EVar16 = EGUIComponentTypeColor3;
LAB_00118a1e:
      bVar6 = false;
      goto LAB_00118a20;
    }
    iVar7 = std::__cxx11::string::compare((char *)&local_c8);
    if (iVar7 == 0) {
      EVar16 = EGUIComponentTypeColor4;
      goto LAB_00118a1e;
    }
    std::operator+(&local_108,"Invalid GUI type name \'",&local_c8);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_108);
    puVar11 = (ulong *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_e8.field_2._M_allocated_capacity = *puVar11;
      local_e8.field_2._8_8_ = plVar9[3];
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *puVar11;
      local_e8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_e8._M_string_length = plVar9[1];
    *plVar9 = (long)puVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    GUIComponentParse::anon_class_16_2_f93b81b2::operator()(&local_a8,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    uVar13 = local_108.field_2._M_allocated_capacity;
    _Var14._M_p = local_108._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) goto LAB_00118e27;
LAB_00118e2f:
    bVar6 = false;
    goto LAB_00118e31;
  }
LAB_00118a20:
  out_component->Type = EVar16;
  if (local_78._M_string_length == 0) {
    if (bVar6) {
      out_component->field_4 = (anon_union_8_1_70c8c71c_for_GUIComponent_4)0x3f80000000000000;
    }
  }
  else if ((bVar6) &&
          (iVar7 = __isoc99_sscanf(local_78._M_dataplus._M_p,"(%f, %f)",&out_component->field_4,
                                   (undefined1 *)((long)&out_component->field_4 + 4)), iVar7 != 2))
  {
    local_e8._M_string_length = 0;
    local_e8.field_2._M_allocated_capacity =
         local_e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::operator+(&local_98,"Invalid format for GUI component data \'",&local_78);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_98);
    paVar2 = &local_108.field_2;
    psVar10 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_108.field_2._M_allocated_capacity = *psVar10;
      local_108.field_2._8_8_ = plVar9[3];
      local_108._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar10;
      local_108._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_108._M_string_length = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_108._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_98,"Format should be @",&local_c8);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_98);
    puVar11 = (ulong *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_108.field_2._M_allocated_capacity = *puVar11;
      local_108.field_2._8_8_ = plVar9[3];
      local_108._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_108.field_2._M_allocated_capacity = *puVar11;
      local_108._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_108._M_string_length = plVar9[1];
    *plVar9 = (long)puVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_108._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    GUIComponentParse::anon_class_16_2_f93b81b2::operator()(&local_a8,&local_e8);
    uVar13 = local_e8.field_2._M_allocated_capacity;
    _Var14._M_p = local_e8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
LAB_00118e27:
      operator_delete(_Var14._M_p,uVar13 + 1);
    }
    goto LAB_00118e2f;
  }
  SplitString(&local_58,uniform_line,' ');
  if ((long)local_58.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_58.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x60) {
    iVar7 = std::__cxx11::string::compare
                      ((char *)local_58.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    if (iVar7 != 0) {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"GUI type not associated with a uniform","");
      GUIComponentParse::anon_class_16_2_f93b81b2::operator()(&local_a8,&local_e8);
      goto LAB_00118b81;
    }
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    pcVar3 = local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar3,
               pcVar3 + local_58.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
    iVar7 = std::__cxx11::string::compare((char *)&local_e8);
    if (iVar7 == 0) {
      EVar8 = EGUIUniformTypeFloat;
LAB_00118e8d:
      out_component->UniformType = EVar8;
      if (5 < (ulong)out_component->Type) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/gui.h"
                      ,0x58,"uint32_t GUIComponents(EGUIComponentType)");
      }
      if (EGUIUniformTypeVec4 < out_component->UniformType) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/gui.h"
                      ,99,"uint32_t GUIUniformVariableComponents(EGUIUniformType)");
      }
      if (*(int *)(&DAT_00164220 + (ulong)out_component->Type * 4) !=
          out_component->UniformType + EGUIUniformTypeVec2) {
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,"GUI component count does not match uniform component count"
                   ,"");
        GUIComponentParse::anon_class_16_2_f93b81b2::operator()(&local_a8,&local_108);
LAB_00118fc7:
        local_98.field_2._M_allocated_capacity = local_108.field_2._M_allocated_capacity;
        local_98._M_dataplus._M_p = local_108._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
LAB_00118fd5:
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00118fdd;
      }
      while (local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p
             [local_58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length - 1] == ';') {
        std::__cxx11::string::pop_back();
      }
      psVar1 = &out_component->UniformName;
      std::__cxx11::string::_M_assign((string *)psVar1);
      iVar7 = std::__cxx11::string::compare((char *)psVar1);
      if ((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)psVar1), iVar7 == 0)) {
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,"GUI type not allowed for builtin uniforms","");
        GUIComponentParse::anon_class_16_2_f93b81b2::operator()(&local_a8,&local_108);
        goto LAB_00118fc7;
      }
      pGVar17 = (local_40->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pGVar4 = (local_40->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      bVar6 = true;
      if (pGVar17 != pGVar4) {
        pcVar3 = (out_component->UniformName)._M_dataplus._M_p;
        sVar5 = (out_component->UniformName)._M_string_length;
        do {
          __n = (pGVar17->UniformName)._M_string_length;
          if ((__n == sVar5) &&
             ((__n == 0 ||
              (iVar7 = bcmp((pGVar17->UniformName)._M_dataplus._M_p,pcVar3,__n), iVar7 == 0)))) {
            uVar13 = *(undefined8 *)(pGVar17->Data + 2);
            *(undefined8 *)out_component->Data = *(undefined8 *)pGVar17->Data;
            *(undefined8 *)(out_component->Data + 2) = uVar13;
          }
          pGVar17 = pGVar17 + 1;
        } while (pGVar17 != pGVar4);
      }
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)&local_e8);
      if (iVar7 == 0) {
        EVar8 = EGUIUniformTypeVec2;
        goto LAB_00118e8d;
      }
      iVar7 = std::__cxx11::string::compare((char *)&local_e8);
      if (iVar7 == 0) {
        EVar8 = EGUIUniformTypeVec3;
        goto LAB_00118e8d;
      }
      iVar7 = std::__cxx11::string::compare((char *)&local_e8);
      if (iVar7 == 0) {
        EVar8 = EGUIUniformTypeVec4;
        goto LAB_00118e8d;
      }
      std::operator+(&local_98,"GUI not supported for uniform type \'",&local_e8);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_98);
      puVar11 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_108.field_2._M_allocated_capacity = *puVar11;
        local_108.field_2._8_8_ = plVar9[3];
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      }
      else {
        local_108.field_2._M_allocated_capacity = *puVar11;
        local_108._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_108._M_string_length = plVar9[1];
      *plVar9 = (long)puVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      GUIComponentParse::anon_class_16_2_f93b81b2::operator()(&local_a8,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) goto LAB_00118fd5;
LAB_00118fdd:
      bVar6 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"GUI associated with invalid uniform","");
    GUIComponentParse::anon_class_16_2_f93b81b2::operator()(&local_a8,&local_e8);
LAB_00118b81:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    bVar6 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
LAB_00118e31:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool GUIComponentParse(uint32_t line_number, const std::string& gui_component_line, const std::string& uniform_line, const std::vector<GUIComponent>& previous_components, GUIComponent& out_component, std::string& out_parse_error) {
    auto ReportError = [&](const std::string& error) {
        out_parse_error = error + " at line " + std::to_string(line_number);
    };
    if (uniform_line.empty()) {
        ReportError("GUI type not associated with any uniform '" + gui_component_line + "'");
        return false;
    }
    uint32_t current_char = 0;
    while (current_char < gui_component_line.size() && gui_component_line[current_char] != '(') {
        ++current_char;
    }

    std::string component_name = gui_component_line.substr(0, current_char);
    std::string component_data = gui_component_line.substr(current_char, std::string::npos);
    if (component_name == "slider1") {
        out_component.Type = EGUIComponentTypeSlider1;
    } else if (component_name == "slider2") {
        out_component.Type = EGUIComponentTypeSlider2;
    } else if (component_name == "slider3") {
        out_component.Type = EGUIComponentTypeSlider3;
    } else if (component_name == "slider4") {
        out_component.Type = EGUIComponentTypeSlider4;
    } else if (component_name == "color3") {
        out_component.Type = EGUIComponentTypeColor3;
    } else if (component_name == "color4") {
        out_component.Type = EGUIComponentTypeColor4;
    } else {
        ReportError("Invalid GUI type name '" + component_name + "'");
        return false;
    }

    if (!component_data.empty()) {
        if (GUIIsSliderType(out_component.Type)) {
            int scanned = sscanf(component_data.c_str(), "(%f, %f)",
                &out_component.SliderRange.Start,
                &out_component.SliderRange.End);
            if (scanned != 2) {
                std::string error;
                error += "Invalid format for GUI component data '" + component_data + "'\n";
                error += "Format should be @" + component_name + "(start_range, end_range)";
                ReportError(error);
                return false;
            }
        }
    } else {
        // Initialize the data with convenient defaults
        if (GUIIsSliderType(out_component.Type)) {
            out_component.SliderRange.Start = 0.0f;
            out_component.SliderRange.End = 1.0f;
        }
    }

    std::vector<std::string> uniform_tokens = SplitString(uniform_line,  ' ');
    if (uniform_tokens.size() != 3) {
        ReportError("GUI associated with invalid uniform");
        return false;
    }

    if (uniform_tokens[0] != "uniform") {
        ReportError("GUI type not associated with a uniform");
        return false;
    }

    std::string uniform_type = uniform_tokens[1];
    if (uniform_type == "float") {
        out_component.UniformType = EGUIUniformTypeFloat;
    } else if (uniform_type == "vec2") {
        out_component.UniformType = EGUIUniformTypeVec2;
    } else if (uniform_type == "vec3") {
        out_component.UniformType = EGUIUniformTypeVec3;
    } else if (uniform_type == "vec4") {
        out_component.UniformType = EGUIUniformTypeVec4;
    } else {
        ReportError("GUI not supported for uniform type '" + uniform_type + "'");
        return false;
    }

    if (GUIComponents(out_component.Type) != GUIUniformVariableComponents(out_component.UniformType)) {
        ReportError("GUI component count does not match uniform component count");
        return false;
    }

    // Trim semicolon ';'
    while (uniform_tokens.back().back() == ';') {
        uniform_tokens.back().pop_back();
    }

    out_component.UniformName = uniform_tokens.back();

    if (out_component.UniformName == "time" || out_component.UniformName == "resolution") {
        ReportError("GUI type not allowed for builtin uniforms");
        return false;
    }

    for (const GUIComponent& previous_component : previous_components) {
        if (previous_component.UniformName == out_component.UniformName) {
            memcpy(&out_component.Data, &previous_component.Data, sizeof(out_component.Data));
        }
    }
    return true;
}